

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.h
# Opt level: O3

void __thiscall crnlib::qdxt1::cluster_id::set(cluster_id *this,vector<unsigned_int> *indices)

{
  uint uVar1;
  uint *puVar2;
  long lVar3;
  uint uVar4;
  uint32 uVar5;
  ulong uVar6;
  uint min_new_capacity;
  int len;
  uint *p;
  
  min_new_capacity = indices->m_size;
  uVar4 = (this->m_cells).m_size;
  uVar1 = min_new_capacity;
  if (uVar4 != min_new_capacity) {
    if (uVar4 <= min_new_capacity) {
      if ((this->m_cells).m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this,min_new_capacity,uVar4 + 1 == min_new_capacity,4,
                   (object_mover)0x0,false);
        uVar4 = (this->m_cells).m_size;
      }
      memset((this->m_cells).m_p + uVar4,0,(ulong)(min_new_capacity - uVar4) << 2);
    }
    (this->m_cells).m_size = min_new_capacity;
    uVar1 = indices->m_size;
  }
  p = (this->m_cells).m_p;
  if (uVar1 != 0) {
    puVar2 = indices->m_p;
    uVar6 = 0;
    do {
      p[uVar6] = puVar2[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar6 < indices->m_size);
    min_new_capacity = (this->m_cells).m_size;
  }
  if (min_new_capacity == 0) {
    len = 0;
  }
  else {
    lVar3 = 0x3f;
    if ((ulong)min_new_capacity != 0) {
      for (; min_new_capacity >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (p,p + min_new_capacity,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
              (p,p + min_new_capacity);
    p = (this->m_cells).m_p;
    len = (this->m_cells).m_size << 2;
  }
  uVar5 = fast_hash(p,len);
  this->m_hash = (ulong)uVar5;
  return;
}

Assistant:

void set(const crnlib::vector<uint>& indices)
            {
                m_cells.resize(indices.size());

                for (uint i = 0; i < indices.size(); i++)
                {
                    m_cells[i] = static_cast<uint32>(indices[i]);
                }

                std::sort(m_cells.begin(), m_cells.end());

                m_hash = fast_hash(&m_cells[0], sizeof(m_cells[0]) * m_cells.size());
            }